

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_buffer_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::ByteBufferTest_test_two_insertion_Test::TestBody
          (ByteBufferTest_test_two_insertion_Test *this)

{
  char *pcVar1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  ByteBuffer byte_buffer;
  
  bidfx_public_api::tools::ByteBuffer::ByteBuffer(&byte_buffer,0xc);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&byte_buffer);
  bidfx_public_api::tools::ByteBuffer::WriteByte((uchar)&byte_buffer);
  local_58.ptr_._0_1_ = 0x61;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::CmpHelperEQ<char,unsigned_char>
            ((internal *)&gtest_ar,"\'a\'","byte_buffer.GetNextByte()",(char *)&local_58,
             (uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x25,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_58.ptr_._0_1_ = 0x62;
  local_50.data_._0_1_ = bidfx_public_api::tools::ByteBuffer::GetNextByte();
  testing::internal::CmpHelperEQ<char,unsigned_char>
            ((internal *)&gtest_ar,"\'b\'","byte_buffer.GetNextByte()",(char *)&local_58,
             (uchar *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/byte_buffer_test.cpp"
               ,0x26,pcVar1);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  bidfx_public_api::tools::ByteBuffer::~ByteBuffer(&byte_buffer);
  return;
}

Assistant:

TEST(ByteBufferTest, test_two_insertion)
{
    ByteBuffer byte_buffer(12);
    byte_buffer.WriteByte('a');
    byte_buffer.WriteByte('b');
    EXPECT_EQ('a', byte_buffer.GetNextByte());
    EXPECT_EQ('b', byte_buffer.GetNextByte());
}